

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_448ecb::Db::parseTemplateArgs(Db *this,bool TagTemplates)

{
  Node **ppNVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  char *pcVar4;
  BumpPointerAllocator **ppBVar5;
  Node **__src;
  Node *pNVar6;
  Node **ppNVar7;
  Node **__dest;
  Node *pNVar8;
  _func_int **pp_Var9;
  _func_int **pp_Var10;
  _func_int **pp_Var11;
  long lVar12;
  long lVar13;
  size_t sVar14;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *this_00;
  Node NVar15;
  type OldParams;
  Node *Arg;
  Node *local_b0;
  Node *local_a8;
  BumpPointerAllocator **local_a0;
  Node local_98 [4];
  BumpPointerAllocator *local_58;
  PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL> *local_50;
  size_t local_48;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *local_40;
  Node *local_38;
  
  pcVar4 = this->First;
  if ((pcVar4 != this->Last) && (*pcVar4 == 'I')) {
    this->First = pcVar4 + 1;
    if (TagTemplates) {
      (this->TemplateParams).Last = (this->TemplateParams).First;
    }
    this_00 = &this->Names;
    local_48 = (long)(this->Names).Last - (long)(this->Names).First >> 3;
    ppNVar1 = (this->TemplateParams).Inline;
    local_50 = &this->ForwardTemplateRefs;
    local_58 = &this->ASTAllocator;
    local_40 = this_00;
    while( true ) {
      while( true ) {
        pcVar4 = this->First;
        if ((pcVar4 != this->Last) && (*pcVar4 == 'E')) {
          this->First = pcVar4 + 1;
          NVar15 = (Node)popTrailingNodeArray(this,local_48);
          pNVar8 = (Node *)BumpPointerAllocator::allocate(local_58,0x20);
          pNVar8->K = KTemplateArgs;
          pNVar8->RHSComponentCache = No;
          pNVar8->ArrayCache = No;
          pNVar8->FunctionCache = No;
          pNVar8->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002085f8;
          pNVar8[1] = NVar15;
          return pNVar8;
        }
        if (TagTemplates) break;
        local_b0 = parseTemplateArg(this);
        if (local_b0 == (Node *)0x0) {
          return (Node *)0x0;
        }
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(this_00,&local_b0);
      }
      local_a0 = &local_58;
      pNVar8 = (Node *)(this->TemplateParams).First;
      if (pNVar8 == (Node *)ppNVar1) {
        sVar14 = (long)(this->TemplateParams).Last - (long)pNVar8;
        local_b0 = local_98;
        if (sVar14 != 0) {
          local_a8 = local_98;
          memmove(local_98,pNVar8,sVar14);
        }
        local_a8 = (Node *)(sVar14 + (long)local_98);
        (this->TemplateParams).Last = (Node **)pNVar8;
      }
      else {
        local_a8 = (Node *)(this->TemplateParams).Last;
        local_a0 = (BumpPointerAllocator **)(this->TemplateParams).Cap;
        (this->TemplateParams).First = ppNVar1;
        (this->TemplateParams).Last = ppNVar1;
        (this->TemplateParams).Cap = (Node **)local_50;
        local_b0 = pNVar8;
      }
      pNVar6 = parseTemplateArg(this);
      pNVar8 = (Node *)(this->TemplateParams).First;
      local_38 = pNVar6;
      if (local_b0 == local_98) {
        if (pNVar8 != (Node *)ppNVar1) {
          free(pNVar8);
          (this->TemplateParams).First = ppNVar1;
          (this->TemplateParams).Last = ppNVar1;
          (this->TemplateParams).Cap = (Node **)local_50;
        }
        if ((long)local_a8 - (long)local_b0 != 0) {
          memmove((this->TemplateParams).First,local_b0,(long)local_a8 - (long)local_b0);
        }
        (this->TemplateParams).Last =
             (Node **)((long)local_a8 + ((long)(this->TemplateParams).First - (long)local_b0));
        local_a8 = local_b0;
      }
      else {
        (this->TemplateParams).First = (Node **)local_b0;
        if (pNVar8 == (Node *)ppNVar1) {
          (this->TemplateParams).Last = (Node **)local_a8;
          (this->TemplateParams).Cap = (Node **)local_a0;
          local_a0 = &local_58;
          local_a8 = local_98;
        }
        else {
          (this->TemplateParams).Last = (Node **)local_a8;
          ppBVar5 = (BumpPointerAllocator **)(this->TemplateParams).Cap;
          (this->TemplateParams).Cap = (Node **)local_a0;
          local_a8 = pNVar8;
          local_a0 = ppBVar5;
        }
      }
      local_b0 = local_a8;
      if (pNVar6 == (Node *)0x0) break;
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(this_00,&local_38);
      if (pNVar6->K == KTemplateArgumentPack) {
        pp_Var10 = pNVar6[1]._vptr_Node;
        lVar13 = *(long *)&pNVar6[1].K;
        pNVar6 = (Node *)BumpPointerAllocator::allocate(local_58,0x20);
        pNVar6->K = KParameterPack;
        pNVar6->RHSComponentCache = Unknown;
        pNVar6->ArrayCache = Unknown;
        pNVar6->FunctionCache = No;
        pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002085a0;
        pNVar6[1]._vptr_Node = pp_Var10;
        pNVar6[1].K = (char)lVar13;
        pNVar6[1].RHSComponentCache = (char)((ulong)lVar13 >> 8);
        pNVar6[1].ArrayCache = (char)((ulong)lVar13 >> 0x10);
        pNVar6[1].FunctionCache = (char)((ulong)lVar13 >> 0x18);
        *(int *)&pNVar6[1].field_0xc = (int)((ulong)lVar13 >> 0x20);
        pNVar6->FunctionCache = Unknown;
        pp_Var2 = pp_Var10 + lVar13;
        uVar3 = lVar13 * 8;
        lVar13 = lVar13 >> 2;
        pp_Var9 = pp_Var10;
        if (0 < lVar13) {
          pp_Var9 = (_func_int **)((uVar3 & 0xffffffffffffffe0) + (long)pp_Var10);
          lVar12 = lVar13 + 1;
          pp_Var11 = pp_Var10 + 2;
          do {
            if (pp_Var11[-2][10] != (_func_int)0x1) {
              pp_Var11 = pp_Var11 + -2;
              goto LAB_001b366e;
            }
            if (pp_Var11[-1][10] != (_func_int)0x1) {
              pp_Var11 = pp_Var11 + -1;
              goto LAB_001b366e;
            }
            if ((*pp_Var11)[10] != (_func_int)0x1) goto LAB_001b366e;
            if (pp_Var11[1][10] != (_func_int)0x1) {
              pp_Var11 = pp_Var11 + 1;
              goto LAB_001b366e;
            }
            lVar12 = lVar12 + -1;
            pp_Var11 = pp_Var11 + 4;
          } while (1 < lVar12);
        }
        lVar12 = (long)pp_Var2 - (long)pp_Var9 >> 3;
        if (lVar12 == 1) {
LAB_001b3648:
          pp_Var11 = pp_Var9;
          if ((*pp_Var9)[10] == (_func_int)0x1) {
            pp_Var11 = pp_Var2;
          }
        }
        else if (lVar12 == 2) {
LAB_001b363b:
          pp_Var11 = pp_Var9;
          if ((*pp_Var9)[10] == (_func_int)0x1) {
            pp_Var9 = pp_Var9 + 1;
            goto LAB_001b3648;
          }
        }
        else {
          pp_Var11 = pp_Var2;
          if ((lVar12 == 3) && (pp_Var11 = pp_Var9, (*pp_Var9)[10] == (_func_int)0x1)) {
            pp_Var9 = pp_Var9 + 1;
            goto LAB_001b363b;
          }
        }
LAB_001b366e:
        if (pp_Var11 == pp_Var2) {
          pNVar6->ArrayCache = No;
        }
        pp_Var9 = pp_Var10;
        if (0 < lVar13) {
          pp_Var9 = (_func_int **)((uVar3 & 0xffffffffffffffe0) + (long)pp_Var10);
          lVar12 = lVar13 + 1;
          pp_Var11 = pp_Var10 + 2;
          do {
            if (pp_Var11[-2][0xb] != (_func_int)0x1) {
              pp_Var11 = pp_Var11 + -2;
              goto LAB_001b372a;
            }
            if (pp_Var11[-1][0xb] != (_func_int)0x1) {
              pp_Var11 = pp_Var11 + -1;
              goto LAB_001b372a;
            }
            if ((*pp_Var11)[0xb] != (_func_int)0x1) goto LAB_001b372a;
            if (pp_Var11[1][0xb] != (_func_int)0x1) {
              pp_Var11 = pp_Var11 + 1;
              goto LAB_001b372a;
            }
            lVar12 = lVar12 + -1;
            pp_Var11 = pp_Var11 + 4;
          } while (1 < lVar12);
        }
        lVar12 = (long)pp_Var2 - (long)pp_Var9 >> 3;
        if (lVar12 == 1) {
LAB_001b3704:
          pp_Var11 = pp_Var9;
          if ((*pp_Var9)[0xb] == (_func_int)0x1) {
            pp_Var11 = pp_Var2;
          }
        }
        else if (lVar12 == 2) {
LAB_001b36f7:
          pp_Var11 = pp_Var9;
          if ((*pp_Var9)[0xb] == (_func_int)0x1) {
            pp_Var9 = pp_Var9 + 1;
            goto LAB_001b3704;
          }
        }
        else {
          pp_Var11 = pp_Var2;
          if ((lVar12 == 3) && (pp_Var11 = pp_Var9, (*pp_Var9)[0xb] == (_func_int)0x1)) {
            pp_Var9 = pp_Var9 + 1;
            goto LAB_001b36f7;
          }
        }
LAB_001b372a:
        if (pp_Var11 == pp_Var2) {
          pNVar6->FunctionCache = No;
        }
        pp_Var9 = pp_Var10;
        if (0 < lVar13) {
          pp_Var9 = (_func_int **)((uVar3 & 0xffffffffffffffe0) + (long)pp_Var10);
          lVar13 = lVar13 + 1;
          pp_Var10 = pp_Var10 + 2;
          do {
            if (pp_Var10[-2][9] != (_func_int)0x1) {
              pp_Var10 = pp_Var10 + -2;
              goto LAB_001b37ee;
            }
            if (pp_Var10[-1][9] != (_func_int)0x1) {
              pp_Var10 = pp_Var10 + -1;
              goto LAB_001b37ee;
            }
            if ((*pp_Var10)[9] != (_func_int)0x1) goto LAB_001b37ee;
            if (pp_Var10[1][9] != (_func_int)0x1) {
              pp_Var10 = pp_Var10 + 1;
              goto LAB_001b37ee;
            }
            lVar13 = lVar13 + -1;
            pp_Var10 = pp_Var10 + 4;
          } while (1 < lVar13);
        }
        lVar13 = (long)pp_Var2 - (long)pp_Var9 >> 3;
        if (lVar13 == 1) {
LAB_001b37c3:
          pp_Var10 = pp_Var9;
          if ((*pp_Var9)[9] == (_func_int)0x1) {
            pp_Var10 = pp_Var2;
          }
        }
        else {
          pp_Var10 = pp_Var9;
          if (lVar13 == 2) {
LAB_001b37b6:
            if ((*pp_Var10)[9] == (_func_int)0x1) {
              pp_Var9 = pp_Var10 + 1;
              goto LAB_001b37c3;
            }
          }
          else {
            pp_Var10 = pp_Var2;
            if ((lVar13 == 3) && (pp_Var10 = pp_Var9, (*pp_Var9)[9] == (_func_int)0x1)) {
              pp_Var10 = pp_Var9 + 1;
              goto LAB_001b37b6;
            }
          }
        }
LAB_001b37ee:
        if (pp_Var10 == pp_Var2) {
          pNVar6->RHSComponentCache = No;
        }
      }
      ppNVar7 = (this->TemplateParams).Last;
      if (ppNVar7 == (this->TemplateParams).Cap) {
        __src = (this->TemplateParams).First;
        sVar14 = (long)ppNVar7 - (long)__src;
        if (__src == ppNVar1) {
          __dest = (Node **)malloc(sVar14 * 2);
          if (__dest == (Node **)0x0) goto LAB_001b3938;
          if (ppNVar7 != __src) {
            memmove(__dest,__src,sVar14);
          }
          (this->TemplateParams).First = __dest;
        }
        else {
          ppNVar7 = (Node **)realloc(__src,sVar14 * 2);
          (this->TemplateParams).First = ppNVar7;
          if (ppNVar7 == (Node **)0x0) {
LAB_001b3938:
            std::terminate();
          }
        }
        ppNVar7 = (this->TemplateParams).First;
        (this->TemplateParams).Last = (Node **)((long)ppNVar7 + sVar14);
        (this->TemplateParams).Cap = ppNVar7 + ((long)sVar14 >> 2);
        this_00 = local_40;
      }
      ppNVar7 = (this->TemplateParams).Last;
      (this->TemplateParams).Last = ppNVar7 + 1;
      *ppNVar7 = pNVar6;
      if (local_b0 != local_98) {
        free(local_b0);
      }
    }
    if (local_a8 != local_98) {
      free(local_a8);
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }